

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::iterate
          (GeometryProgramQueryCase *this)

{
  pointer ppSVar1;
  size_type *psVar2;
  ostream *poVar3;
  pointer ppSVar4;
  Functions *pFVar5;
  ostringstream *this_00;
  TestLog *pTVar6;
  RenderContext *pRVar7;
  TestContext *this_01;
  bool bVar8;
  ContextType CVar9;
  GLSLVersion GVar10;
  int iVar11;
  int iVar12;
  deUint32 dVar13;
  char *pcVar14;
  long *plVar15;
  undefined4 extraout_var;
  undefined8 *puVar16;
  TestError *this_02;
  long *plVar17;
  size_type *psVar18;
  Functions *pFVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  glActiveShaderProgramFunc p_Var22;
  undefined8 uVar23;
  long lVar24;
  long lVar25;
  string geometrySource;
  ScopedLogSection section;
  char *vtxSourcePtr;
  char *fragSourcePtr;
  string vertexSource;
  ScopedLogSection section_1;
  string fragmentSource;
  Shader fragmentShader;
  StateQueryMemoryWriteGuard<int> state;
  ShaderProgram program;
  char *geomSourcePtr;
  ShaderProgram program_1;
  string local_428;
  ScopedLogSection local_408;
  string local_400;
  long *local_3e0;
  long *local_3d8;
  long local_3d0;
  long local_3c8;
  long lStack_3c0;
  undefined1 local_3b8 [8];
  value_type local_3b0;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  undefined1 local_358 [8];
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_340 [4];
  bool local_300;
  undefined1 local_2f0 [8];
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [4];
  bool local_298;
  undefined1 local_288 [88];
  bool local_230;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  bool bStack_1c8;
  undefined8 uStack_1c7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  bool bStack_f0;
  undefined8 uStack_ef;
  
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(CVar9,(ApiType)0x23);
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar10 = glu::getContextTypeGLSLVersion(CVar9);
  pcVar14 = glu::getGLSLVersionDeclaration(GVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar14,(allocator<char> *)local_288);
  plVar15 = (long *)std::__cxx11::string::append(local_1b0);
  local_3d8 = &local_3c8;
  plVar17 = plVar15 + 2;
  if ((long *)*plVar15 == plVar17) {
    local_3c8 = *plVar17;
    lStack_3c0 = plVar15[3];
  }
  else {
    local_3c8 = *plVar17;
    local_3d8 = (long *)*plVar15;
  }
  local_3d0 = plVar15[1];
  *plVar15 = (long)plVar17;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar10 = glu::getContextTypeGLSLVersion(CVar9);
  pcVar14 = glu::getGLSLVersionDeclaration(GVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,pcVar14,(allocator<char> *)local_288);
  plVar15 = (long *)std::__cxx11::string::append(local_1b0);
  local_378 = &local_368;
  plVar17 = plVar15 + 2;
  if ((long *)*plVar15 == plVar17) {
    local_368 = *plVar17;
    lStack_360 = plVar15[3];
  }
  else {
    local_368 = *plVar17;
    local_378 = (long *)*plVar15;
  }
  local_370 = plVar15[1];
  *plVar15 = (long)plVar17;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  if (0 < (int)((ulong)((long)(this->m_cases).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_cases).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar24 = 0;
    do {
      pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Case","");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,
                 (this->m_cases).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar24].description,
                 (allocator<char> *)local_358);
      tcu::ScopedLogSection::ScopedLogSection
                (&local_408,pTVar6,(string *)local_1b0,(string *)local_288);
      if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
        operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      pcVar14 = (this->m_cases).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar24].header;
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 "void main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n",
                 "");
      strlen(pcVar14);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,(ulong)pcVar14)
      ;
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      psVar18 = (size_type *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_428.field_2._M_allocated_capacity = *psVar18;
        local_428.field_2._8_8_ = plVar15[3];
      }
      else {
        local_428.field_2._M_allocated_capacity = *psVar18;
        local_428._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_428._M_string_length = plVar15[1];
      *plVar15 = (long)psVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
      memset((MessageBuilder *)local_1b0,0,0xac);
      local_100._M_allocated_capacity = 0;
      local_100._M_local_buf[8] = '\0';
      local_100._9_7_ = 0;
      bStack_f0 = false;
      uStack_ef = 0;
      local_358 = (undefined1  [8])((ulong)local_358 & 0xffffffff00000000);
      local_350._0_8_ = aaStack_340;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_350,local_3d8,(long)local_3d8 + local_3d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_358 & 0xffffffff) * 0x18),(value_type *)local_350);
      local_2f0._0_4_ = 1;
      local_2e8._0_8_ = local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,local_378,(long)local_378 + local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_2f0 & 0xffffffff) * 0x18),(value_type *)local_2e8);
      iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      local_3e0 = (long *)CONCAT44(local_3e0._4_4_,iVar11);
      specializeShader(&local_400,&local_428,(ContextType *)&local_3e0);
      local_3b8._0_4_ = 2;
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b0,local_400._M_dataplus._M_p,
                 local_400._M_dataplus._M_p + local_400._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_3b8 & 0xffffffff) * 0x18),&local_3b0);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_288,pRVar7,(ProgramSources *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._0_8_ != local_2d8) {
        operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._0_8_ != aaStack_340) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT44(aaStack_340[0]._M_allocated_capacity._4_4_,
                                 (undefined4)aaStack_340[0]._M_allocated_capacity) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_100);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_120);
      lVar25 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + lVar25));
        lVar25 = lVar25 + -0x18;
      } while (lVar25 != -0x18);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      (ShaderProgram *)local_288);
      dVar13 = (deUint32)
               local_1f8.
               super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar11 = (this->m_cases).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar24].value;
      iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      local_2f0 = (undefined1  [8])0xdededededededede;
      local_2e8._0_4_ = 0xdededede;
      (**(code **)(CONCAT44(extraout_var,iVar12) + 0x9d8))(dVar13,this->m_target,local_2f0 + 4);
      dVar13 = (**(code **)(CONCAT44(extraout_var,iVar12) + 0x800))();
      glu::checkError(dVar13,"getProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                      ,0xfd6);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      local_358 = (undefined1  [8])glu::getProgramParamName;
      local_350._0_4_ = this->m_target;
      poVar3 = (ostream *)(local_1b0 + 8);
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_358,poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
      std::ostream::operator<<(poVar3,local_2f0._4_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
      std::ios_base::~ios_base(local_138);
      if (local_2f0._4_4_ != iVar11) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        poVar3 = (ostream *)(local_1b0 + 8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"// ERROR: Expected ",0x13);
        std::ostream::operator<<(poVar3,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got ",6);
        std::ostream::operator<<(poVar3,local_2f0._4_4_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
        std::ios_base::~ios_base(local_138);
        this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"got invalid value");
        }
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      tcu::TestLog::endSection(local_408.m_log);
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)((ulong)((long)(this->m_cases).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_cases).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"NoGeometryShader","");
  ppSVar4 = (pointer)(local_288 + 0x10);
  local_288._0_8_ = ppSVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"No geometry shader","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_3b8,pTVar6,(string *)local_1b0,(string *)local_288);
  if ((pointer)local_288._0_8_ != ppSVar4) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_288,0,0xac);
  local_1d8._M_allocated_capacity = 0;
  local_1d8._M_local_buf[8] = '\0';
  local_1d8._9_7_ = 0;
  bStack_1c8 = false;
  uStack_1c7 = 0;
  local_358 = (undefined1  [8])((ulong)local_358 & 0xffffffff00000000);
  local_350._0_8_ = aaStack_340;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_350,local_3d8,(long)local_3d8 + local_3d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + ((ulong)local_358 & 0xffffffff) * 0x18),(value_type *)local_350);
  local_2f0._0_4_ = 1;
  local_2e8._0_8_ = local_2d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e8,local_378,(long)local_378 + local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + ((ulong)local_2f0 & 0xffffffff) * 0x18),(value_type *)local_2e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1b0,pRVar7,(ProgramSources *)local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._0_8_ != local_2d8) {
    operator_delete((void *)local_2e8._0_8_,local_2d8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ != aaStack_340) {
    operator_delete((void *)local_350._0_8_,
                    CONCAT44(aaStack_340[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_340[0]._M_allocated_capacity) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar24 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar24));
    lVar24 = lVar24 + -0x18;
  } while (lVar24 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_1b0);
  expectQueryError(this,(deUint32)
                        local_120.
                        super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1b0);
  tcu::TestLog::endSection((TestLog *)local_3b8);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"NotLinkedProgram","");
  local_288._0_8_ = ppSVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"Shader program not linked","");
  tcu::ScopedLogSection::ScopedLogSection(&local_408,pTVar6,(string *)local_1b0,(string *)local_288)
  ;
  if ((pointer)local_288._0_8_ != ppSVar4) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  CVar9.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar10 = glu::getContextTypeGLSLVersion(CVar9);
  pcVar14 = glu::getGLSLVersionDeclaration(GVar10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2f0,pcVar14,(allocator<char> *)&local_3e0);
  plVar15 = (long *)std::__cxx11::string::append(local_2f0);
  pFVar5 = (Functions *)(local_350 + 8);
  pFVar19 = (Functions *)(plVar15 + 2);
  if ((Functions *)*plVar15 == pFVar19) {
    local_350._8_8_ = pFVar19->activeShaderProgram;
    aaStack_340[0]._0_4_ = (undefined4)plVar15[3];
    aaStack_340[0]._4_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_358 = (undefined1  [8])pFVar5;
  }
  else {
    local_350._8_8_ = pFVar19->activeShaderProgram;
    local_358 = (undefined1  [8])*plVar15;
  }
  pcVar14 = "#extension GL_EXT_geometry_shader : require\n";
  if (bVar8) {
    pcVar14 = "";
  }
  local_350._0_8_ = plVar15[1];
  *plVar15 = (long)pFVar19;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  psVar18 = &local_3b0._M_string_length;
  pcVar21 = pcVar14 + 0x2c;
  if (bVar8) {
    pcVar21 = pcVar14;
  }
  local_3b8 = (undefined1  [8])psVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,pcVar14,pcVar21);
  p_Var22 = (glActiveShaderProgramFunc)0xf;
  if (local_358 != (undefined1  [8])pFVar5) {
    p_Var22 = (glActiveShaderProgramFunc)local_350._8_8_;
  }
  if (p_Var22 < local_3b0._M_dataplus._M_p + local_350._0_8_) {
    p_Var22 = (glActiveShaderProgramFunc)0xf;
    if (local_3b8 != (undefined1  [8])psVar18) {
      p_Var22 = (glActiveShaderProgramFunc)local_3b0._M_string_length;
    }
    if (p_Var22 < local_3b0._M_dataplus._M_p + local_350._0_8_) goto LAB_003990a3;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_3b8,0,(char *)0x0,(ulong)local_358);
  }
  else {
LAB_003990a3:
    puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_358,(ulong)local_3b8);
  }
  ppSVar1 = (pointer)(puVar16 + 2);
  if ((pointer)*puVar16 == ppSVar1) {
    local_288._16_8_ = *ppSVar1;
    local_288._24_8_ = puVar16[3];
    local_288._0_8_ = ppSVar4;
  }
  else {
    local_288._16_8_ = *ppSVar1;
    local_288._0_8_ = (pointer)*puVar16;
  }
  local_288._8_8_ = puVar16[1];
  *puVar16 = ppSVar1;
  puVar16[1] = 0;
  *(undefined1 *)ppSVar1 = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_288);
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 == paVar20) {
    local_1a0[0]._0_8_ = paVar20->_M_allocated_capacity;
    local_1a0[0]._8_4_ = (undefined4)plVar15[3];
    local_1a0[0]._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
    local_1b0._0_8_ = local_1a0;
  }
  else {
    local_1a0[0]._0_8_ = paVar20->_M_allocated_capacity;
    local_1b0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar15;
  }
  local_1b0._8_8_ = plVar15[1];
  *plVar15 = (long)paVar20;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  paVar20 = &local_400.field_2;
  local_400._M_dataplus._M_p = (pointer)paVar20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_400,
             "void main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n","");
  uVar23 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    uVar23 = local_1a0[0]._M_allocated_capacity;
  }
  if ((ulong)uVar23 < local_400._M_string_length + local_1b0._8_8_) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != paVar20) {
      uVar23 = local_400.field_2._M_allocated_capacity;
    }
    if (local_400._M_string_length + local_1b0._8_8_ <= (ulong)uVar23) {
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,local_1b0._0_8_);
      goto LAB_00399206;
    }
  }
  puVar16 = (undefined8 *)
            std::__cxx11::string::_M_append(local_1b0,(ulong)local_400._M_dataplus._M_p);
LAB_00399206:
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  psVar2 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_428.field_2._M_allocated_capacity = *psVar2;
    local_428.field_2._8_8_ = puVar16[3];
  }
  else {
    local_428.field_2._M_allocated_capacity = *psVar2;
    local_428._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_428._M_string_length = puVar16[1];
  *puVar16 = psVar2;
  puVar16[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != paVar20) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_288._0_8_ != ppSVar4) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  if (local_3b8 != (undefined1  [8])psVar18) {
    operator_delete((void *)local_3b8,(ulong)(local_3b0._M_string_length + 1));
  }
  if (local_358 != (undefined1  [8])pFVar5) {
    operator_delete((void *)local_358,(ulong)(local_350._8_8_ + 1));
  }
  if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
    operator_delete((void *)local_2f0,local_2e8._8_8_ + 1);
  }
  local_400._M_dataplus._M_p = (pointer)local_3d8;
  local_3e0 = local_378;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p;
  glu::Shader::Shader((Shader *)local_288,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_VERTEX);
  glu::Shader::Shader((Shader *)local_358,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_FRAGMENT);
  glu::Shader::Shader((Shader *)local_2f0,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_GEOMETRY);
  glu::Program::Program((Program *)local_3b8,((this->super_TestCase).m_context)->m_renderCtx);
  glu::Shader::setSources((Shader *)local_288,1,(char **)&local_400,(int *)0x0);
  glu::Shader::setSources((Shader *)local_358,1,(char **)&local_3e0,(int *)0x0);
  glu::Shader::setSources((Shader *)local_2f0,1,(char **)&local_1b8,(int *)0x0);
  glu::Shader::compile((Shader *)local_288);
  glu::Shader::compile((Shader *)local_358);
  glu::Shader::compile((Shader *)local_2f0);
  if (((local_230 == true) && (local_300 == true)) && (local_298 != false)) {
    glu::Program::attachShader((Program *)local_3b8,local_288._8_4_);
    glu::Program::attachShader((Program *)local_3b8,local_350._0_4_);
    glu::Program::attachShader((Program *)local_3b8,local_2e8._0_4_);
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Creating a program with geometry shader, but not linking it",0x3b
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    expectQueryError(this,(deUint32)local_3b0._M_dataplus._M_p);
    glu::Program::~Program((Program *)local_3b8);
    glu::Shader::~Shader((Shader *)local_2f0);
    glu::Shader::~Shader((Shader *)local_358);
    glu::Shader::~Shader((Shader *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endSection(local_408.m_log);
    if (local_378 != &local_368) {
      operator_delete(local_378,local_368 + 1);
    }
    if (local_3d8 != &local_3c8) {
      operator_delete(local_3d8,local_3c8 + 1);
    }
    return STOP;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Failed to compile shader","")
  ;
  tcu::TestError::TestError(this_02,(string *)local_1b0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryProgramQueryCase::IterateResult GeometryProgramQueryCase::iterate (void)
{
	const bool			supportsES32			= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const std::string	vertexSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	const std::string	fragmentSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "layout(location = 0) out mediump vec4 fragColor;\n"
												  "void main ()\n"
												  "{\n"
												  "	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	static const char*	s_geometryBody			="void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "	EmitVertex();\n"
												  "}\n";

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// default cases
	for (int ndx = 0; ndx < (int)m_cases.size(); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "Case", m_cases[ndx].description);
		const std::string			geometrySource	= m_cases[ndx].header + std::string(s_geometryBody);
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource)
														<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));

		m_testCtx.getLog() << program;
		expectProgramValue(program.getProgram(), m_cases[ndx].value);
	}

	// no geometry shader -case (INVALID OP)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "NoGeometryShader", "No geometry shader");
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << program;
		expectQueryError(program.getProgram());
	}

	// not linked -case (INVALID OP)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "NotLinkedProgram", "Shader program not linked");
		const std::string	geometrySource				= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
														+ std::string(supportsES32 ? "" : "#extension GL_EXT_geometry_shader : require\n")
														+ "layout (triangles) in;\n"
														"layout (points, max_vertices = 3) out;\n"
														+ std::string(s_geometryBody);


		const char* const			vtxSourcePtr	= vertexSource.c_str();
		const char* const			fragSourcePtr	= fragmentSource.c_str();
		const char* const			geomSourcePtr	= geometrySource.c_str();

		glu::Shader					vertexShader	(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
		glu::Shader					fragmentShader	(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
		glu::Shader					geometryShader	(m_context.getRenderContext(), glu::SHADERTYPE_GEOMETRY);
		glu::Program				program			(m_context.getRenderContext());

		vertexShader.setSources(1, &vtxSourcePtr, DE_NULL);
		fragmentShader.setSources(1, &fragSourcePtr, DE_NULL);
		geometryShader.setSources(1, &geomSourcePtr, DE_NULL);

		vertexShader.compile();
		fragmentShader.compile();
		geometryShader.compile();

		if (!vertexShader.getCompileStatus()   ||
			!fragmentShader.getCompileStatus() ||
			!geometryShader.getCompileStatus())
			throw tcu::TestError("Failed to compile shader");

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		program.attachShader(geometryShader.getShader());

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating a program with geometry shader, but not linking it" << tcu::TestLog::EndMessage;

		expectQueryError(program.getProgram());
	}

	return STOP;
}